

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkAbcUtil.c
# Opt level: O1

int Lpk_FunSuppMinimize(Lpk_Fun_t *p)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  uint nVars;
  
  uVar1 = *(uint *)&p->field_0x8 >> 7;
  uVar4 = p->uSupp;
  if ((-1 << ((byte)uVar1 & 0x1f) ^ uVar4) == 0xffffffff) {
    iVar2 = 0;
  }
  else {
    *(uint *)&p->field_0x8 = *(uint *)&p->field_0x8 & 0xbfffffff;
    uVar5 = (uVar4 >> 1 & 0x55555555) + (uVar4 & 0x55555555);
    uVar5 = (uVar5 >> 2 & 0x33333333) + (uVar5 & 0x33333333);
    uVar5 = (uVar5 >> 4 & 0x7070707) + (uVar5 & 0x7070707);
    uVar5 = (uVar5 >> 8 & 0xf000f) + (uVar5 & 0xf000f);
    nVars = (uVar5 >> 0x10) + (uVar5 & 0xffff);
    uVar1 = uVar1 & 0x1f;
    uVar5 = 1 << ((char)uVar1 - 5U & 0x1f);
    if (uVar1 < 6) {
      uVar5 = 1;
    }
    Kit_TruthShrink(p[1].puSupps + ((ulong)uVar5 - 4),(uint *)(p + 1),nVars,uVar1,uVar4,1);
    lVar3 = 0;
    uVar4 = 0;
    do {
      if ((p->uSupp >> ((uint)lVar3 & 0x1f) & 1) != 0) {
        p->pFanins[(int)uVar4] = p->pFanins[lVar3];
        p->pDelays[(int)uVar4] = p->pDelays[lVar3];
        uVar4 = uVar4 + 1;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x10);
    if (uVar4 != nVars) {
      __assert_fail("k == nVarsNew",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/lpk/lpkAbcUtil.c"
                    ,0xa9,"int Lpk_FunSuppMinimize(Lpk_Fun_t *)");
    }
    *(uint *)&p->field_0x8 = *(uint *)&p->field_0x8 & 0xfffff07f | (uVar4 & 0x1f) << 7;
    p->uSupp = ~(-1 << ((byte)uVar4 & 0x1f));
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int Lpk_FunSuppMinimize( Lpk_Fun_t * p )
{
    int i, k, nVarsNew;
    // compress the truth table
    if ( p->uSupp == Kit_BitMask(p->nVars) )
        return 0;
    // invalidate support info
    p->fSupports = 0;
//Extra_PrintBinary( stdout, &p->uSupp, p->nVars ); printf( "\n" );
    // minimize support
    nVarsNew = Kit_WordCountOnes(p->uSupp);
    Kit_TruthShrink( Lpk_FunTruth(p, 1), Lpk_FunTruth(p, 0), nVarsNew, p->nVars, p->uSupp, 1 );
    k = 0;
    Lpk_SuppForEachVar( p->uSupp, i )
    {
        p->pFanins[k] = p->pFanins[i];
        p->pDelays[k] = p->pDelays[i];
/*
        if ( p->fSupports )
        {
            p->puSupps[2*k+0] = p->puSupps[2*i+0];
            p->puSupps[2*k+1] = p->puSupps[2*i+1];
        }
*/
        k++;
    }
    assert( k == nVarsNew );
    p->nVars = k;
    p->uSupp = Kit_BitMask(p->nVars);
    return 1;
}